

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall
de::Random::
choose<__gnu_cxx::__normal_iterator<rsg::TexLookup::Type*,std::vector<rsg::TexLookup::Type,std::allocator<rsg::TexLookup::Type>>>,rsg::TexLookup::Type*>
          (Random *this,
          __normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
          first,__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
                last,Type *result,int numItems)

{
  int iVar1;
  int ndx;
  int max;
  
  max = 0;
  do {
    if (first._M_current == last._M_current) {
      return;
    }
    iVar1 = max;
    if (max < numItems) {
LAB_0054b3a7:
      result[iVar1] = *first._M_current;
    }
    else {
      iVar1 = getInt(this,0,max);
      if (iVar1 < numItems) goto LAB_0054b3a7;
    }
    first._M_current = first._M_current + 1;
    max = max + 1;
  } while( true );
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}